

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gain_calculator_objects.cpp
# Opt level: O2

void __thiscall
ear::GainCalculatorObjectsImpl::calculate
          (GainCalculatorObjectsImpl *this,ObjectsTypeMetadata *metadata,OutputGains *direct,
          OutputGains *diffuse,WarningCB *param_4)

{
  VectorXd *this_00;
  double dVar1;
  double height;
  double depth;
  PolarPosition position_00;
  undefined8 uVar2;
  undefined8 uVar3;
  type pPVar4;
  not_implemented *pnVar5;
  double in_stack_fffffffffffffed0;
  Vector3d position;
  ConstantReturnType local_100;
  VectorXd pv_full;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  local_b8;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  local_90;
  Vector3d local_68;
  Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>> local_48 [24];
  
  if (metadata->cartesian == true) {
    pnVar5 = (not_implemented *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&position,"cartesian",(allocator<char> *)&local_100);
    not_implemented::not_implemented(pnVar5,(string *)&position);
    __cxa_throw(pnVar5,&not_implemented::typeinfo,std::runtime_error::~runtime_error);
  }
  boost::variant<ear::CartesianPosition,ear::PolarPosition>::
  apply_visitor<ear::throw_if_not_implemented_const>
            ((variant<ear::CartesianPosition,ear::PolarPosition> *)metadata,
             (throw_if_not_implemented *)&position);
  boost::variant<ear::PolarObjectDivergence,ear::CartesianObjectDivergence>::
  apply_visitor<ear::throw_if_not_implemented_const>
            ((variant<ear::PolarObjectDivergence,ear::CartesianObjectDivergence> *)
             &metadata->objectDivergence,(throw_if_not_implemented *)&position);
  if ((metadata->channelLock).flag == true) {
    pnVar5 = (not_implemented *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&position,"channelLock",(allocator<char> *)&local_100);
    not_implemented::not_implemented(pnVar5,(string *)&position);
    __cxa_throw(pnVar5,&not_implemented::typeinfo,std::runtime_error::~runtime_error);
  }
  if ((metadata->zoneExclusion).zones.
      super__Vector_base<boost::variant<ear::PolarExclusionZone,_ear::CartesianExclusionZone>,_std::allocator<boost::variant<ear::PolarExclusionZone,_ear::CartesianExclusionZone>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (metadata->zoneExclusion).zones.
      super__Vector_base<boost::variant<ear::PolarExclusionZone,_ear::CartesianExclusionZone>,_std::allocator<boost::variant<ear::PolarExclusionZone,_ear::CartesianExclusionZone>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    pnVar5 = (not_implemented *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&position,"zoneExclusion",(allocator<char> *)&local_100);
    not_implemented::not_implemented(pnVar5,(string *)&position);
    __cxa_throw(pnVar5,&not_implemented::typeinfo,std::runtime_error::~runtime_error);
  }
  if (metadata->screenRef != true) {
    pPVar4 = boost::relaxed_get<ear::PolarPosition,ear::CartesianPosition,ear::PolarPosition>
                       (&metadata->position);
    uVar2 = pPVar4->elevation;
    uVar3 = pPVar4->distance;
    position_00.elevation = (double)uVar3;
    position_00.azimuth = (double)uVar2;
    position_00.distance = in_stack_fffffffffffffed0;
    toCartesianVector3d(position_00);
    local_68.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
         = position.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[2];
    local_68.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
         = position.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[0];
    local_68.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
         = position.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[1];
    dVar1 = metadata->width;
    height = metadata->height;
    depth = metadata->depth;
    this_00 = &this->_pvTmp;
    Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::InnerStride<1>>::
    Ref<Eigen::Matrix<double,_1,1,0,_1,1>>
              (local_48,&this_00->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
               (type *)0x0);
    PolarExtent::handle(&this->_polarExtentPanner,&local_68,dVar1,height,depth,
                        (Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> *)
                        local_48);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator*=
              ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)this_00,&metadata->gain);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::Zero
              (&local_100,
               (this->_isLfe).super_PlainObjectBase<Eigen::Array<bool,__1,_1,_0,__1,_1>_>.m_storage.
               m_rows);
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
    PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&pv_full,
               (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                *)&local_100);
    local_100.m_rows.m_value = (long)&this->_isLfe;
    mask_write<Eigen::Matrix<double,_1,1,0,_1,1>&,Eigen::CwiseUnaryOp<Eigen::internal::scalar_boolean_not_op<bool>,Eigen::Array<bool,_1,1,0,_1,1>const>,Eigen::Matrix<double,_1,1,0,_1,1>>
              ((Matrix<double,__1,_1,_0,__1,_1> *)&pv_full,
               (CwiseUnaryOp<Eigen::internal::scalar_boolean_not_op<bool>,_const_Eigen::Array<bool,__1,_1,_0,__1,_1>_>
                *)&local_100,this_00);
    dVar1 = 1.0 - metadata->diffuse;
    if (dVar1 < 0.0) {
      local_100.m_rows.m_value = (long)sqrt(dVar1);
    }
    else {
      local_100.m_rows.m_value = (long)SQRT(dVar1);
    }
    Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator*
              (&local_90,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&pv_full,
               (double *)&local_100);
    OutputGains::
    write_vector<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
              (direct,&local_90);
    dVar1 = metadata->diffuse;
    if (dVar1 < 0.0) {
      local_100.m_rows.m_value = (long)sqrt(dVar1);
    }
    else {
      local_100.m_rows.m_value = (long)SQRT(dVar1);
    }
    Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator*
              (&local_b8,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&pv_full,
               (double *)&local_100);
    OutputGains::
    write_vector<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
              (diffuse,&local_b8);
    free(pv_full.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
    return;
  }
  pnVar5 = (not_implemented *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&position,"screenRef",(allocator<char> *)&local_100);
  not_implemented::not_implemented(pnVar5,(string *)&position);
  __cxa_throw(pnVar5,&not_implemented::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void GainCalculatorObjectsImpl::calculate(const ObjectsTypeMetadata& metadata,
                                            OutputGains& direct,
                                            OutputGains& diffuse,
                                            const WarningCB&) {
    if (metadata.cartesian) throw not_implemented("cartesian");
    boost::apply_visitor(throw_if_not_implemented(), metadata.position);
    boost::apply_visitor(throw_if_not_implemented(), metadata.objectDivergence);
    if (metadata.channelLock.flag) throw not_implemented("channelLock");
    if (metadata.zoneExclusion.zones.size())
      throw not_implemented("zoneExclusion");
    if (metadata.screenRef) throw not_implemented("screenRef");

    Eigen::Vector3d position =
        toCartesianVector3d(boost::get<PolarPosition>(metadata.position));
    _polarExtentPanner.handle(position, metadata.width, metadata.height,
                              metadata.depth, _pvTmp);
    _pvTmp *= metadata.gain;

    Eigen::VectorXd pv_full = Eigen::VectorXd::Zero(_isLfe.size());
    mask_write(pv_full, !_isLfe, _pvTmp);

    // apply diffuse split
    direct.write_vector(pv_full * std::sqrt(1.0 - metadata.diffuse));
    diffuse.write_vector(pv_full * std::sqrt(metadata.diffuse));
  }